

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O0

double rapidjson::internal::StrtodNormalPrecision(double d,int p)

{
  double significand;
  double dStack_10;
  int p_local;
  double d_local;
  
  if (p < -0x134) {
    significand = FastPath(d,-0x134);
    dStack_10 = FastPath(significand,p + 0x134);
  }
  else {
    dStack_10 = FastPath(d,p);
  }
  return dStack_10;
}

Assistant:

inline double StrtodNormalPrecision(double d, int p) {
    if (p < -308) {
        // Prevent expSum < -308, making Pow10(p) = 0
        d = FastPath(d, -308);
        d = FastPath(d, p + 308);
    }
    else
        d = FastPath(d, p);
    return d;
}